

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteBlif.c
# Opt level: O0

void Cba_ManWriteBlifLines(FILE *pFile,Cba_Ntk_t *p)

{
  Abc_Nam_t *p_00;
  int iVar1;
  int i;
  Cba_Ntk_t *p_01;
  char *pcVar2;
  char *pcVar3;
  Mio_Library_t *pLib_00;
  Mio_Gate_t *pGate_00;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib;
  char *pGateName;
  Cba_Ntk_t *pNtk;
  int iFon;
  int iFin;
  int iObj;
  int k;
  Cba_Ntk_t *p_local;
  FILE *pFile_local;
  
  for (iFon = 1; iVar1 = Vec_StrSize(&p->vObjType), iFon < iVar1; iFon = iFon + 1) {
    iVar1 = Cba_ObjIsBox(p,iFon);
    if (iVar1 != 0) {
      iVar1 = Cba_ObjIsBoxUser(p,iFon);
      if (iVar1 == 0) {
        iVar1 = Cba_ObjIsGate(p,iFon);
        if (iVar1 == 0) {
          fprintf((FILE *)pFile,".names");
          for (pNtk._4_4_ = Cba_ObjFin0(p,iFon); iVar1 = Cba_ObjFin0(p,iFon + 1), pNtk._4_4_ < iVar1
              ; pNtk._4_4_ = pNtk._4_4_ + 1) {
            iVar1 = Cba_FinFon(p,pNtk._4_4_);
            pcVar2 = Cba_FonNameStr(p,iVar1);
            fprintf((FILE *)pFile," %s",pcVar2);
          }
          iVar1 = Cba_ObjFon0(p,iFon);
          pcVar2 = Cba_FonNameStr(p,iVar1);
          fprintf((FILE *)pFile," %s",pcVar2);
          iVar1 = Cba_ObjFunc(p,iFon);
          pcVar2 = Cba_NtkSop(p,iVar1);
          fprintf((FILE *)pFile,"\n%s",pcVar2);
        }
        else {
          p_00 = p->pDesign->pMods;
          iVar1 = Cba_ObjNtkId(p,iFon);
          pcVar2 = Abc_NamStr(p_00,iVar1);
          pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
          pGate_00 = Mio_LibraryReadGateByName(pLib_00,pcVar2,(char *)0x0);
          fprintf((FILE *)pFile,".gate %s",pcVar2);
          iFin = 0;
          for (pNtk._4_4_ = Cba_ObjFin0(p,iFon); iVar1 = Cba_ObjFin0(p,iFon + 1), pNtk._4_4_ < iVar1
              ; pNtk._4_4_ = pNtk._4_4_ + 1) {
            iVar1 = Cba_FinFon(p,pNtk._4_4_);
            pcVar2 = Mio_GateReadPinName(pGate_00,iFin);
            pcVar3 = Cba_FonNameStr(p,iVar1);
            fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
            iFin = iFin + 1;
          }
          for (pNtk._0_4_ = Cba_ObjFon0(p,iFon); iVar1 = Cba_ObjFon0(p,iFon + 1), (int)pNtk < iVar1;
              pNtk._0_4_ = (int)pNtk + 1) {
            pcVar2 = Mio_GateReadOutName(pGate_00);
            pcVar3 = Cba_FonNameStr(p,(int)pNtk);
            fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
          }
          fprintf((FILE *)pFile,"\n");
        }
      }
      else {
        p_01 = Cba_ObjNtk(p,iFon);
        fprintf((FILE *)pFile,".subckt");
        pcVar2 = Cba_NtkName(p_01);
        fprintf((FILE *)pFile," %s",pcVar2);
        iFin = 0;
        for (pNtk._4_4_ = Cba_ObjFin0(p,iFon); iVar1 = Cba_ObjFin0(p,iFon + 1), pNtk._4_4_ < iVar1;
            pNtk._4_4_ = pNtk._4_4_ + 1) {
          iVar1 = Cba_FinFon(p,pNtk._4_4_);
          i = Cba_NtkPi(p_01,iFin);
          pcVar2 = Cba_ObjNameStr(p_01,i);
          pcVar3 = Cba_FonNameStr(p,iVar1);
          fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
          iFin = iFin + 1;
        }
        iFin = 0;
        for (pNtk._0_4_ = Cba_ObjFon0(p,iFon); iVar1 = Cba_ObjFon0(p,iFon + 1), (int)pNtk < iVar1;
            pNtk._0_4_ = (int)pNtk + 1) {
          iVar1 = Cba_NtkPo(p_01,iFin);
          pcVar2 = Cba_ObjNameStr(p_01,iVar1);
          pcVar3 = Cba_FonNameStr(p,(int)pNtk);
          fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
          iFin = iFin + 1;
        }
        fprintf((FILE *)pFile,"\n");
      }
    }
  }
  return;
}

Assistant:

void Cba_ManWriteBlifLines( FILE * pFile, Cba_Ntk_t * p )
{
    int k, iObj, iFin, iFon;
    Cba_NtkForEachBox( p, iObj )
    {
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            Cba_Ntk_t * pNtk = Cba_ObjNtk( p, iObj );
            fprintf( pFile, ".subckt" );
            fprintf( pFile, " %s", Cba_NtkName(pNtk) );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s=%s", Cba_ObjNameStr(pNtk, Cba_NtkPi(pNtk, k)), Cba_FonNameStr(p, iFon) );
            Cba_ObjForEachFon( p, iObj, iFon, k )
                fprintf( pFile, " %s=%s", Cba_ObjNameStr(pNtk, Cba_NtkPo(pNtk, k)), Cba_FonNameStr(p, iFon) );
            fprintf( pFile, "\n" );
        }
        else if ( Cba_ObjIsGate(p, iObj) )
        {
            char * pGateName = Abc_NamStr(p->pDesign->pMods, Cba_ObjNtkId( p, iObj ));
            Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pGateName, NULL );
            fprintf( pFile, ".gate %s", pGateName );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s=%s", Mio_GateReadPinName(pGate, k), Cba_FonNameStr(p, iFon) );
            Cba_ObjForEachFon( p, iObj, iFon, k )
                fprintf( pFile, " %s=%s", Mio_GateReadOutName(pGate), Cba_FonNameStr(p, iFon) );
            fprintf( pFile, "\n" );
        }
        else
        {
            fprintf( pFile, ".names" );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s", Cba_FonNameStr(p, iFon) );
            fprintf( pFile, " %s", Cba_FonNameStr(p, Cba_ObjFon0(p, iObj)) );
            fprintf( pFile, "\n%s",  Cba_NtkSop(p, Cba_ObjFunc(p, iObj)) );
        }
    }
}